

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O1

size_t absl::lts_20240722::log_internal::FormatLogPrefix
                 (LogSeverity severity,Time timestamp,Tid tid,string_view basename,int line,
                 PrefixFormat format,Span<char> *buf)

{
  int extraout_EAX;
  uint uVar1;
  long lVar2;
  undefined1 *puVar3;
  ulong uVar4;
  undefined2 *puVar5;
  char *pcVar6;
  HiRep HVar7;
  char *pcVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  Nonnull<char_*> __n;
  LogSeverity unaff_EBP;
  pointer pcVar9;
  Nonnull<char_*> output;
  int iVar10;
  Nonnull<char_*> n;
  char *pcVar11;
  HiRep unaff_R14;
  ulong unaff_R15;
  Time TVar12;
  Time TVar13;
  CivilInfo ci;
  char *local_80;
  int local_6c;
  int local_68;
  int local_64;
  FormatSpec<char,_int,_int,_int> local_60;
  Duration local_50;
  
  pcVar8 = basename._M_str;
  __n = (Nonnull<char_*>)basename._M_len;
  if (buf->len_ < 0x22) {
    buf->len_ = 0;
    n = (Nonnull<char_*>)0x0;
    severity = unaff_EBP;
  }
  else {
    output = (Nonnull<char_*>)(ulong)(uint)tid;
    unaff_R15 = (ulong)timestamp.rep_.rep_lo_;
    lVar2 = absl::lts_20240722::log_internal::TimeZone();
    n = output;
    unaff_R14 = timestamp.rep_.rep_hi_;
    local_80 = pcVar8;
    if (lVar2 == 0) goto LAB_001026a1;
    pcVar11 = buf->ptr_;
    if (severity < 4) {
      pcVar6 = (&PTR_anon_var_dwarf_88_00104ca8)[severity];
    }
    else {
      pcVar6 = "UNKNOWN";
    }
    *pcVar11 = *pcVar6;
    TVar12.rep_.rep_lo_ = (uint32_t)lVar2;
    TVar12.rep_.rep_hi_ = (HiRep)&local_60;
    absl::lts_20240722::TimeZone::At(TVar12);
    absl::lts_20240722::numbers_internal::PutTwoDigits
              ((int)(char)local_60.super_type.spec_.size_,pcVar11 + 1);
    absl::lts_20240722::numbers_internal::PutTwoDigits
              ((int)local_60.super_type.spec_.size_._1_1_,pcVar11 + 3);
    unaff_R15 = CONCAT71((uint7)timestamp.rep_.rep_lo_._1_3_,0x20);
    pcVar11[5] = ' ';
    absl::lts_20240722::numbers_internal::PutTwoDigits
              ((int)local_60.super_type.spec_.size_._2_1_,pcVar11 + 6);
    pcVar11[8] = ':';
    absl::lts_20240722::numbers_internal::PutTwoDigits
              ((int)local_60.super_type.spec_.size_._3_1_,pcVar11 + 9);
    pcVar11[0xb] = ':';
    absl::lts_20240722::numbers_internal::PutTwoDigits
              ((int)local_60.super_type.spec_.size_._4_1_,pcVar11 + 0xc);
    pcVar11[0xe] = '.';
    lVar2 = absl::lts_20240722::ToInt64Microseconds(local_50);
    absl::lts_20240722::numbers_internal::PutTwoDigits
              ((int)(SUB168(SEXT816(lVar2) * SEXT816(0x346dc5d63886594b),8) >> 0xb) -
               (SUB164(SEXT816(lVar2) * SEXT816(0x346dc5d63886594b),0xc) >> 0x1f),pcVar11 + 0xf);
    unaff_R14 = (HiRep)(lVar2 / 100);
    absl::lts_20240722::numbers_internal::PutTwoDigits
              (unaff_R14.lo_ +
               ((int)(SUB168(SEXT816((long)unaff_R14) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
               (SUB164(SEXT816((long)unaff_R14) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)) * -100,
               pcVar11 + 0x11);
    severity = (int)lVar2 + unaff_R14.lo_ * -100;
    absl::lts_20240722::numbers_internal::PutTwoDigits(severity,pcVar11 + 0x13);
    pcVar11[0x15] = ' ';
    if ((uint)tid < 10) {
      pcVar11[0x16] = ' ';
      pcVar11 = pcVar11 + 0x17;
    }
    else {
      pcVar11 = pcVar11 + 0x16;
    }
    if (tid + 9U < 0x6d) {
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
    }
    if (tid + 99U < 1099) {
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
    }
    if (tid + 999U < 10999) {
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
    }
    if (tid + 9999U < 109999) {
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
    }
    if (tid + 99999U < 1099999) {
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
    }
    puVar3 = (undefined1 *)absl::lts_20240722::numbers_internal::FastIntToBuffer(tid,pcVar11);
    *puVar3 = 0x20;
    n = puVar3 + (1 - (long)buf->ptr_);
    if ((Nonnull<char_*>)buf->len_ < n) {
      FormatLogPrefix();
      goto LAB_001026eb;
    }
    buf->ptr_ = n + (long)buf->ptr_;
    buf->len_ = (long)buf->len_ - (long)n;
  }
  do {
    while( true ) {
      if ((Nonnull<char_*>)buf->len_ < __n) {
        __n = (Nonnull<char_*>)buf->len_;
      }
      memcpy(buf->ptr_,pcVar8,(size_t)__n);
      uVar4 = (long)buf->len_ - (long)__n;
      if ((Nonnull<char_*>)buf->len_ < __n) break;
      pcVar9 = buf->ptr_ + (long)__n;
      buf->ptr_ = pcVar9;
      buf->len_ = uVar4;
      if (uVar4 < 0xe) {
        HVar7.lo_ = 0;
        HVar7.hi_ = 0;
        uVar4 = 0;
      }
      else {
        output = (Nonnull<char_*>)(ulong)(uint)line;
        *pcVar9 = ':';
        pcVar11 = pcVar9 + 1;
        puVar5 = (undefined2 *)absl::lts_20240722::numbers_internal::FastIntToBuffer(line,pcVar11);
        *puVar5 = 0x205d;
        uVar4 = (long)puVar5 + (2 - (long)buf->ptr_);
        HVar7 = (HiRep)(buf->len_ - uVar4);
        if (buf->len_ < uVar4) {
LAB_001026eb:
          iVar10 = (int)n;
          FormatLogPrefix();
          local_64 = extraout_EAX;
          local_68 = extraout_EDX_00;
          goto LAB_001026f0;
        }
        buf->ptr_ = buf->ptr_ + uVar4;
      }
      __n = n + (long)(__n + uVar4);
      buf->len_ = (size_type)HVar7;
      if (format != kRaw) {
        return (size_t)__n;
      }
      unaff_R14.lo_ = 5;
      unaff_R14.hi_ = 0;
      if ((ulong)HVar7 < 5) {
        unaff_R14 = HVar7;
      }
      memcpy(buf->ptr_,"RAW: ",(size_t)unaff_R14);
      if ((ulong)unaff_R14 <= buf->len_) {
        buf->ptr_ = buf->ptr_ + (long)unaff_R14;
        buf->len_ = buf->len_ - (long)unaff_R14;
        return (size_t)(__n + (long)unaff_R14);
      }
      FormatLogPrefix();
LAB_00102739:
      n = (Nonnull<char_*>)0x0;
      pcVar8 = local_80;
    }
    FormatLogPrefix();
LAB_001026a1:
    iVar10 = (int)n;
    TVar13.rep_.rep_lo_ = (uint32_t)unaff_R15;
    TVar13.rep_.rep_hi_ = unaff_R14;
    local_64 = absl::lts_20240722::ToTimeval(TVar13);
    output = buf->ptr_;
    pcVar11 = (char *)buf->len_;
    local_60.super_type.spec_.data_ = "%c0000 00:00:%02d.%06d %7d ";
    local_60.super_type.spec_.size_ = 0x1b;
    local_68 = extraout_EDX;
    if (severity < 4) {
      pcVar8 = (&PTR_anon_var_dwarf_88_00104ca8)[severity];
    }
    else {
LAB_001026f0:
      pcVar8 = "UNKNOWN";
    }
    local_6c = iVar10;
    uVar1 = SNPrintF<char,_int,_int,_int>
                      (output,(size_t)pcVar11,&local_60,pcVar8,&local_64,&local_68,&local_6c);
    if ((int)uVar1 < 0) goto LAB_00102739;
    n = (Nonnull<char_*>)(ulong)uVar1;
    Span<char>::remove_prefix(buf,(size_type)n);
    pcVar8 = local_80;
  } while( true );
}

Assistant:

size_t FormatLogPrefix(absl::LogSeverity severity, absl::Time timestamp,
                       log_internal::Tid tid, absl::string_view basename,
                       int line, PrefixFormat format, absl::Span<char>& buf) {
  auto prefix_size = FormatBoundedFields(severity, timestamp, tid, buf);
  prefix_size += log_internal::AppendTruncated(basename, buf);
  prefix_size += FormatLineNumber(line, buf);
  if (format == PrefixFormat::kRaw)
    prefix_size += log_internal::AppendTruncated("RAW: ", buf);
  return prefix_size;
}